

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O2

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,VarList *var_list,void *data)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ExpVarData_conflict exp_var_data;
  int local_38;
  int local_34;
  
  uVar3 = (ulong)((long)(var_list->var_list_).
                        super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(var_list->var_list_).
                       super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar2 = (int)uVar3;
  if (*(int *)((long)data + 4) - *data == iVar2) {
    uVar4 = 0;
    uVar3 = uVar3 & 0xffffffff;
    if (iVar2 < 1) {
      uVar3 = uVar4;
    }
    iVar2 = *data;
    for (; uVar3 * 8 != uVar4; uVar4 = uVar4 + 8) {
      _local_38 = CONCAT44(iVar2 + 1,iVar2);
      plVar1 = *(long **)((long)&(((var_list->var_list_).
                                   super__Vector_base<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                 super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>
                                 ._M_t + uVar4);
      (**(code **)(*plVar1 + 0x10))(plVar1,this,&local_38);
      iVar2 = iVar2 + 1;
    }
    return;
  }
  __assert_fail("end_register - register_id == var_count",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x4b1,"virtual void luna::CodeGenerateVisitor::Visit(VarList *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(VarList *var_list, void *data)
    {
        auto var_list_data = static_cast<VarListData *>(data);
        int register_id = var_list_data->start_register_;
        int end_register = var_list_data->end_register_;
        int var_count = var_list->var_list_.size();
        assert(end_register - register_id == var_count);

        // Assign results to each variable
        for (int i = 0; i < var_count; ++i, ++register_id)
        {
            ExpVarData exp_var_data{ register_id, register_id + 1 };
            var_list->var_list_[i]->Accept(this, &exp_var_data);
        }
    }